

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O3

void __thiscall Jupiter::GenericCommand::~GenericCommand(GenericCommand *this)

{
  _Atomic_word *p_Var1;
  GenericCommandNamespace *pGVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer ppPVar4;
  int iVar5;
  pointer ppGVar6;
  size_t __n;
  pointer __dest;
  Plugin **plugin;
  pointer ppPVar7;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_00146248;
  pGVar2 = this->m_parent;
  ppPVar7 = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar4 = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pGVar2 != (GenericCommandNamespace *)0x0) {
    __dest = (pGVar2->m_commands).
             super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppGVar6 = (pGVar2->m_commands).
              super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (__dest != ppGVar6) {
      __n = (long)ppGVar6 - (long)__dest;
      do {
        __n = __n - 8;
        if (*__dest == this) {
          if (__dest + 1 != ppGVar6) {
            memmove(__dest,__dest + 1,__n);
            ppGVar6 = (pGVar2->m_commands).
                      super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          (pGVar2->m_commands).
          super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppGVar6 + -1;
          pGVar2->m_should_update_help = true;
          ppPVar7 = g_plugins.
                    super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppPVar4 = g_plugins.
                    super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          break;
        }
        __dest = __dest + 1;
      } while (__dest != ppGVar6);
    }
  }
  for (; ppPVar7 != ppPVar4; ppPVar7 = ppPVar7 + 1) {
    (*((*ppPVar7)->super_Thinker)._vptr_Thinker[0x1b])(*ppPVar7,this);
  }
  p_Var3 = (this->super_enable_shared_from_this<Jupiter::GenericCommand>)._M_weak_this.
           super___weak_ptr<Jupiter::GenericCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
    }
  }
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_00146328;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_Command).m_triggers);
  return;
}

Assistant:

Jupiter::GenericCommand::~GenericCommand() {
	// Inform the parent
	if (GenericCommand::m_parent != nullptr) {
		GenericCommand::m_parent->removeCommand(*this);
	}

	// Notify plugins
	for (auto& plugin : Jupiter::plugins) {
		plugin->OnGenericCommandRemove(*this);
	}
}